

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O2

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream,int fillmask,int filldata)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint n;
  
  n = bitstream->cnt_;
  if ((int)n < 1) {
    uVar3 = 0;
    if (n != 0) {
      n = 0;
      goto LAB_00118eab;
    }
    n = 0;
    if ((char)bitstream->buf_ != -1) goto LAB_00118eab;
    n = 7;
  }
  lVar1 = jpc_bitstream_getbits(bitstream,n);
  uVar3 = (uint)lVar1;
  if ((int)uVar3 < 0) {
    return -1;
  }
LAB_00118eab:
  if ((char)bitstream->buf_ == -1) {
    lVar1 = jpc_bitstream_getbits(bitstream,7);
    if ((int)(uint)lVar1 < 0) {
      return -1;
    }
    uVar3 = uVar3 << 7 | (uint)lVar1;
    n = n + 7;
  }
  if (n < 8) {
    bVar2 = 7 - (char)n;
    filldata = filldata >> (bVar2 & 0x1f);
    fillmask = fillmask >> (bVar2 & 0x1f);
  }
  else {
    uVar3 = (int)uVar3 >> ((char)n - 7U & 0x1f);
  }
  return (uint)(((filldata ^ uVar3) & fillmask) != 0);
}

Assistant:

int jpc_bitstream_inalign(jpc_bitstream_t *bitstream, int fillmask,
  int filldata)
{
	int n;
	int v;
	int u;
	int numfill;
	int m;

	numfill = 7;
	m = 0;
	v = 0;
	if (bitstream->cnt_ > 0) {
		n = bitstream->cnt_;
	} else if (!bitstream->cnt_) {
		n = ((bitstream->buf_ & 0xff) == 0xff) ? 7 : 0;
	} else {
		n = 0;
	}
	if (n > 0) {
		if ((u = jpc_bitstream_getbits(bitstream, n)) < 0) {
			return -1;
		}
		m += n;
		v = (v << n) | u;
	}
	if ((bitstream->buf_ & 0xff) == 0xff) {
		if ((u = jpc_bitstream_getbits(bitstream, 7)) < 0) {
			return -1;
		}
		v = (v << 7) | u;
		m += 7;
	}
	if (m > numfill) {
		v >>= m - numfill;
	} else {
		filldata >>= numfill - m;
		fillmask >>= numfill - m;
	}
	if (((~(v ^ filldata)) & fillmask) != fillmask) {
		/* The actual fill pattern does not match the expected one. */
		return 1;
	}

	return 0;
}